

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetinfo.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  runtime_error *this;
  pointer pvVar3;
  ostream *poVar4;
  ostream *this_00;
  void *this_01;
  long in_RSI;
  VCDU vcdu;
  array<unsigned_char,_892UL> buf;
  ifstream f;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  VCDU local_5d8 [37];
  int *in_stack_fffffffffffffb50;
  char (*in_stack_fffffffffffffb58) [2];
  char (*in_stack_fffffffffffffb60) [101];
  char (*in_stack_fffffffffffffb68) [32];
  string local_248 [48];
  char local_218 [532];
  int local_4;
  
  local_4 = 0;
  std::ifstream::ifstream(local_218,*(undefined8 *)(in_RSI + 8),8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      pvVar3 = std::array<unsigned_char,_892UL>::data((array<unsigned_char,_892UL> *)0x102413);
      std::array<unsigned_char,_892UL>::size
                ((array<unsigned_char,_892UL> *)((long)&local_5d8[1].data_ + 7));
      std::istream::read(local_218,(long)pvVar3);
      bVar1 = std::ios::eof();
      if ((bVar1 & 1) != 0) break;
      VCDU::VCDU(local_5d8,(raw *)((long)&local_5d8[1].data_ + 7));
      poVar4 = std::operator<<((ostream *)&std::cout,"SCID: ");
      iVar2 = VCDU::getSCID((VCDU *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,", VCID: ");
      iVar2 = VCDU::getVCID((VCDU *)0x1024d9);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      this_00 = std::operator<<(poVar4,", counter: ");
      in_stack_fffffffffffff9c4 = VCDU::getCounter((VCDU *)poVar4);
      this_01 = (void *)std::ostream::operator<<(this_00,in_stack_fffffffffffff9c4);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    }
    local_4 = 0;
    std::ifstream::~ifstream(local_218);
    return local_4;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[32],char[101],char[2],int>
            (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
             in_stack_fffffffffffffb50);
  std::runtime_error::runtime_error(this,local_248);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  std::ifstream f(argv[1]);
  ASSERT(f.good());

  std::array<uint8_t, 892> buf;
  for (;;) {
    f.read((char*) buf.data(), buf.size());
    if (f.eof()) {
      break;
    }

    VCDU vcdu(buf);
    std::cout
      << "SCID: " << vcdu.getSCID()
      << ", VCID: " << vcdu.getVCID()
      << ", counter: " << vcdu.getCounter()
      << std::endl;
  }

  return 0;
}